

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<ot::commissioner::State_()>::ExplainMatchResultTo
          (TypedExpectation<ot::commissioner::State_()> *this,ArgumentTuple *args,ostream *os)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  ExpectationSet unsatisfied_prereqs;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [8];
  _Base_ptr local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this[0x84] == (TypedExpectation<ot::commissioner::State_()>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: the expectation is active\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(os,"           Actual: it is retired\n",0x21)
    ;
    return;
  }
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_1c0 = (undefined1  [8])0x0;
  local_1c8 = (undefined1  [8])&PTR__MatchResultListener_002da950;
  cVar1 = (**(code **)(**(long **)(this + 0x100) + 0x20))(*(long **)(this + 0x100),args);
  if (cVar1 == '\0') {
    local_1c0 = (undefined1  [8])&local_1a8;
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_002daab8;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    cVar1 = (**(code **)(**(long **)(this + 0x100) + 0x20))(*(long **)(this + 0x100),args,local_1c8)
    ;
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"    Expected args: ",0x13);
      (**(code **)(**(long **)(this + 0x100) + 0x10))(*(long **)(this + 0x100),os);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"\n           Actual: don\'t match",0x1f);
      std::__cxx11::stringbuf::str();
      iVar5 = std::__cxx11::string::compare((char *)&local_1e8);
      if (iVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    }
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_002daab8;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"The call matches the expectation.\n",0x22);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"         Expected: all pre-requisites are satisfied\n",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"           Actual: the following immediate pre-requisites ",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>(os,"are not satisfied:\n",0x13);
      local_1c0 = (undefined1  [8])((ulong)local_1c0 & 0xffffffff00000000);
      local_1b8 = (_Base_ptr)0x0;
      local_1a0 = 0;
      local_1b0 = (_Rb_tree_node_base *)local_1c0;
      local_1a8 = (_Rb_tree_node_base *)local_1c0;
      ExpectationBase::FindUnsatisfiedPrerequisites
                ((ExpectationBase *)this,(ExpectationSet *)local_1c8);
      if (local_1b0 != (_Rb_tree_node_base *)local_1c0) {
        iVar5 = 0;
        p_Var4 = local_1b0;
        do {
          ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var4 + 1),os);
          std::__ostream_insert<char,std::char_traits<char>>(os,"pre-requisite #",0xf);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          iVar5 = iVar5 + 1;
        } while (p_Var4 != (_Rb_tree_node_base *)local_1c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"                   (end of pre-requisites)\n",0x2b);
      std::
      _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
      ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                   *)local_1c8);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }